

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.cpp
# Opt level: O2

void __kmp_dispatch_init<long_long>
               (ident_t *loc,int gtid,sched_type schedule,longlong lb,longlong ub,
               signed_t_conflict st,signed_t_conflict chunk,int push_ws)

{
  int iVar1;
  kmp_info_t *pkVar2;
  kmp_team_p *pkVar3;
  undefined1 base [16];
  int iVar4;
  kmp_info_t *pkVar5;
  sched_type *psVar6;
  ulong uVar7;
  code *pcVar8;
  ulong uVar9;
  long lVar10;
  unsigned_t_conflict uVar11;
  code *pcVar12;
  void *pvVar13;
  void *pvVar14;
  void *pvVar15;
  longdouble *__return_storage_ptr__;
  uint uVar16;
  cons_type cVar17;
  char *y;
  ulong uVar18;
  sched_type sVar19;
  longdouble *plVar20;
  kmp_uint64 sched_type;
  sched_type sVar21;
  longdouble *__return_storage_ptr___00;
  dispatch_private_info_t *pdVar22;
  bool bVar23;
  bool bVar24;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble x;
  longdouble in_ST2;
  longdouble lVar25;
  longdouble in_ST3;
  longdouble lVar26;
  longdouble lVar27;
  longdouble lVar28;
  longdouble lVar29;
  longdouble lVar30;
  undefined2 in_stack_fffffffffffffeb2;
  undefined4 in_stack_fffffffffffffeb4;
  uint local_110;
  void *local_108;
  void *local_d8;
  dispatch_shared_info_t *local_90;
  kmp_msg_t local_78;
  kmp_msg_t local_60;
  kmp_msg_t local_48;
  
  if (__kmp_init_parallel == 0) {
    __kmp_parallel_initialize();
  }
  pkVar5 = (kmp_info_t *)__kmp_threads;
  pkVar2 = __kmp_threads[gtid];
  pkVar3 = (pkVar2->th).th_team;
  iVar1 = (pkVar3->t).t_serialized;
  (pkVar2->th).th_ident = loc;
  bVar24 = false;
  if ((__kmp_itt_metadata_add_ptr__3_0 != (__kmp_itt_metadata_add_t *)0x0) &&
     (__kmp_forkjoin_frames_mode == 3)) {
    pkVar5 = *(kmp_info_t **)((long)pkVar5 + (long)gtid * 8);
    if ((*(int *)(pkVar5->th_pad + 0x20) == 0) &&
       ((pkVar2->th).th_teams_microtask == (microtask_t)0x0)) {
      bVar24 = (pkVar3->t).t_active_level == 1;
    }
    else {
      bVar24 = false;
    }
  }
  local_110 = (uint)pkVar5;
  y = (char *)(pkVar2->th).th_dispatch;
  if (iVar1 == 0) {
    local_110 = *(uint *)(y + 0x28);
    *(uint *)(y + 0x28) = local_110 + 1;
    pdVar22 = ((pkVar2->th).th_dispatch)->th_disp_buffer +
              (ulong)local_110 % (ulong)(uint)__kmp_dispatch_num_buffers;
    local_90 = (pkVar3->t).t_disp_buffer +
               (ulong)local_110 % (ulong)(uint)__kmp_dispatch_num_buffers;
    y = (char *)&__kmp_dispatch_num_buffers;
  }
  else {
    pdVar22 = *(dispatch_private_info_t **)(y + 0x20);
  }
  sVar19 = schedule & ~(kmp_sch_modifier_nonmonotonic|kmp_sch_modifier_monotonic);
  bVar23 = sVar19 - kmp_nm_lower < 0x28;
  sVar21 = sVar19 - 0x80;
  if (!bVar23) {
    sVar21 = sVar19;
  }
  pdVar22->nomerge = (uint)bVar23;
  sVar19 = sVar21 - kmp_sch_lower;
  if ((sVar21 & kmp_ord_lower) == 0) {
    sVar19 = sVar21;
  }
  pdVar22->type_size = 8;
  pdVar22->ordered = (sVar21 & kmp_ord_lower) >> 6;
  if (sVar19 == kmp_sch_runtime) {
    sVar21 = (pkVar3->t).t_sched.r_sched_type;
    if (sVar21 == kmp_sch_default) {
      psVar6 = &__kmp_static;
LAB_00151674:
      sVar21 = *psVar6;
    }
    else if (sVar21 == kmp_sch_guided_chunked) {
      psVar6 = &__kmp_guided;
      goto LAB_00151674;
    }
    chunk = (signed_t_conflict)(pkVar3->t).t_sched.chunk;
    local_d8 = (void *)chunk;
LAB_00151681:
    if (sVar21 == kmp_sch_auto) {
      sVar21 = __kmp_auto;
    }
    if ((0x100000 < (pkVar3->t).t_nproc) && (sVar21 == kmp_sch_guided_analytical_chunked)) {
      y = (char *)0x40059;
      __kmp_msg_format(&local_48,kmp_i18n_msg_DispatchManyThreads);
      __kmp_msg(kmp_ms_warning);
      sVar21 = kmp_sch_guided_iterative_chunked;
      in_stack_fffffffffffffeb2 = local_48.str._2_2_;
      in_stack_fffffffffffffeb4 = local_48.str._4_4_;
    }
    (pdVar22->u).p64.field_6.parm1 = (kmp_int64)local_d8;
    local_108 = (void *)chunk;
  }
  else {
    sVar21 = __kmp_guided;
    if ((sVar19 == kmp_sch_guided_chunked) || (sVar21 = sVar19, sVar19 != kmp_sch_default)) {
      local_d8 = (void *)0x1;
      if (1 < chunk) {
        local_d8 = (void *)chunk;
      }
      goto LAB_00151681;
    }
    local_108 = (void *)chunk;
    local_d8 = (void *)chunk;
    sVar21 = __kmp_static;
  }
  uVar16 = sVar21 - kmp_sch_static_chunked;
  if (0xc < uVar16) {
    y = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-openmp-runtime/src/kmp_dispatch.cpp"
    ;
    __kmp_debug_assert("assertion failure",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-openmp-runtime/src/kmp_dispatch.cpp"
                       ,0x2ff);
  }
  (pdVar22->u).p64.count = 0;
  if ((st == 0) && (__kmp_env_consistency_check != 0)) {
    cVar17 = ct_pdo_ordered - (pdVar22->ordered == 0);
    y = (char *)(ulong)cVar17;
    __kmp_error_construct(kmp_i18n_msg_CnsLoopIncrZeroProhibited,cVar17,loc);
LAB_001517ac:
    if (ub < lb) {
LAB_001517b4:
      bVar23 = false;
      goto LAB_001517c0;
    }
    uVar7 = (ulong)(ub - lb) / (ulong)st;
LAB_001517d6:
    bVar23 = false;
LAB_001517d9:
    uVar7 = uVar7 + 1;
  }
  else {
    if (st != 1) {
      if (-1 < st) goto LAB_001517ac;
      if (ub <= lb) {
        uVar7 = (ulong)(lb - ub) / (ulong)-st;
        goto LAB_001517d6;
      }
      goto LAB_001517b4;
    }
    bVar23 = true;
    uVar7 = ub - lb;
    if (lb <= ub) goto LAB_001517d9;
LAB_001517c0:
    uVar7 = 0;
  }
  (pdVar22->u).p64.lb = lb;
  (pdVar22->u).p64.ub = ub;
  (pdVar22->u).p64.st = st;
  (pdVar22->u).p64.tc = uVar7;
  if (iVar1 == 0) {
    if (pdVar22->ordered == 0) {
      pcVar8 = __kmp_dispatch_dxo_error;
      pcVar12 = __kmp_dispatch_deo_error;
    }
    else {
      pdVar22->ordered_bumped = 0;
      (pdVar22->u).p64.ordered_lower = 1;
      (pdVar22->u).p64.ordered_upper = 0;
      pcVar8 = __kmp_dispatch_dxo<unsigned_long_long>;
      pcVar12 = __kmp_dispatch_deo<unsigned_long_long>;
    }
    ((pkVar2->th).th_dispatch)->th_deo_fcn = pcVar12;
    ((pkVar2->th).th_dispatch)->th_dxo_fcn = pcVar8;
    y = (char *)pkVar2;
  }
  if (__kmp_env_consistency_check != 0) {
    cVar17 = ct_pdo_ordered - (pdVar22->ordered == 0);
    if (push_ws == 0) {
      y = (char *)(ulong)cVar17;
      __kmp_check_workshare(gtid,cVar17,loc);
      cVar17 = ct_none;
    }
    else {
      y = (char *)(ulong)cVar17;
      __kmp_push_workshare(gtid,cVar17,loc);
    }
    pdVar22->pushed_ws = cVar17;
  }
  if (0xb < uVar16) {
switchD_001518c5_caseD_1:
    __kmp_msg_format(&local_60,kmp_i18n_msg_UnknownSchedTypeDetected);
    __kmp_msg_format(&local_78,kmp_i18n_hnt_GetNewerLibrary);
    pvVar13 = (void *)__kmp_msg_null._16_8_;
    __kmp_msg(kmp_ms_fatal);
    goto LAB_00151d98;
  }
  pvVar13 = (void *)((long)&switchD_001518c5::switchdataD_001675e8 +
                    (long)(int)(&switchD_001518c5::switchdataD_001675e8)[uVar16]);
  switch(uVar16) {
  case 0:
  case 2:
    if ((pdVar22->u).p64.field_6.parm1 < 1) {
      (pdVar22->u).p64.field_6.parm1 = 1;
    }
    break;
  default:
    goto switchD_001518c5_caseD_1;
  case 6:
    pvVar13 = (void *)((long)uVar7 / ((long)(pkVar3->t).t_nproc * 2));
    if ((long)pvVar13 < 2) {
      pvVar13 = (void *)0x1;
    }
    pvVar15 = pvVar13;
    if ((long)local_d8 < (long)pvVar13) {
      pvVar15 = local_d8;
    }
    if ((long)local_d8 < 1) {
      pvVar15 = (void *)0x1;
    }
    lVar10 = (long)((long)pvVar15 + (long)pvVar13 + uVar7 * 2 + -1) /
             ((long)pvVar15 + (long)pvVar13);
    if (lVar10 < 3) {
      lVar10 = 2;
    }
    (pdVar22->u).p64.field_6.parm1 = (kmp_int64)pvVar15;
    (pdVar22->u).p64.field_6.parm2 = (kmp_int64)pvVar13;
    (pdVar22->u).p64.field_6.parm3 = lVar10;
    (pdVar22->u).p64.field_6.parm4 = ((long)pvVar13 - (long)pvVar15) / (lVar10 + -1);
    sVar21 = kmp_sch_trapezoidal;
    break;
  case 7:
    pvVar13 = (void *)(long)(pkVar3->t).t_nproc;
    uVar9 = uVar7;
    if (1 < (long)pvVar13) {
      uVar9 = (long)((long)pvVar13 + (uVar7 - 1)) / (long)pvVar13;
    }
    (pdVar22->u).p64.field_6.parm1 = uVar9;
    goto LAB_00151bc7;
  case 8:
    iVar4 = (pkVar3->t).t_nproc;
    uVar18 = (ulong)iVar4;
    goto LAB_00151bed;
  case 9:
    iVar4 = (pkVar3->t).t_nproc;
    lVar10 = (long)iVar4;
    if (1 < lVar10) {
      pvVar13 = (void *)(((long)local_d8 * 2 + 1) * lVar10);
      if ((long)pvVar13 < (long)uVar7) {
        sVar21 = kmp_sch_guided_iterative_chunked;
        (pdVar22->u).p64.field_6.parm2 = ((long)local_d8 * 2 + 2) * lVar10;
        *(double *)((long)&pdVar22->u + 0x50) = 0.5 / (double)iVar4;
        break;
      }
      goto LAB_00151c97;
    }
LAB_00151a97:
    (pdVar22->u).p64.field_6.parm1 = uVar7;
LAB_00151bc7:
    sVar21 = kmp_sch_static_greedy;
    break;
  case 10:
    iVar4 = (pkVar3->t).t_nproc;
    if ((long)iVar4 < 2) goto LAB_00151a97;
    pvVar13 = (void *)(((long)local_d8 * 2 + 1) * (long)iVar4);
    if ((long)pvVar13 < (long)uVar7) {
      lVar26 = (((longdouble)(long)local_d8 + (longdouble)(long)local_d8 + (longdouble)1) *
               (longdouble)iVar4) / (longdouble)(long)uVar7;
      x = (longdouble)-0.5 / (longdouble)iVar4 + (longdouble)1;
      *(longdouble *)((long)&pdVar22->u + 0x50) = x;
      __return_storage_ptr__ = (longdouble *)0xe5;
      lVar27 = in_ST3;
      lVar28 = in_ST3;
      lVar30 = in_ST3;
      __kmp_pow<unsigned_long_long>((longdouble *)0xe5,x,(unsigned_long_long)y);
      if (in_ST0 <= lVar26) {
        __return_storage_ptr___00 = (longdouble *)0x0;
      }
      else {
        __return_storage_ptr__ = (longdouble *)0xe5;
        do {
          __return_storage_ptr___00 = __return_storage_ptr__;
          in_ST0 = in_ST0 * in_ST0;
          __return_storage_ptr__ = (longdouble *)((long)__return_storage_ptr___00 * 2);
          if (in_ST0 <= lVar26) break;
        } while (__return_storage_ptr___00 < (longdouble *)0x4000000);
      }
      while (lVar29 = lVar30, lVar25 = in_ST3, plVar20 = __return_storage_ptr___00,
            (longdouble *)((long)plVar20 + 1U) < __return_storage_ptr__) {
        __return_storage_ptr___00 =
             (longdouble *)((ulong)((long)__return_storage_ptr__ + (long)plVar20) >> 1);
        lVar30 = lVar29;
        __kmp_pow<unsigned_long_long>(__return_storage_ptr___00,x,(unsigned_long_long)y);
        bVar23 = in_ST1 <= lVar26;
        in_ST1 = in_ST2;
        in_ST2 = lVar25;
        in_ST3 = lVar27;
        lVar27 = lVar28;
        lVar28 = lVar29;
        if (bVar23) {
          __return_storage_ptr__ = __return_storage_ptr___00;
          __return_storage_ptr___00 = plVar20;
        }
      }
      if (((__return_storage_ptr__ == (longdouble *)0x0) ||
          (__kmp_pow<unsigned_long_long>
                     ((longdouble *)((long)__return_storage_ptr__ + -1),x,(unsigned_long_long)y),
          in_ST1 <= lVar26)) ||
         (__kmp_pow<unsigned_long_long>(__return_storage_ptr__,x,(unsigned_long_long)y),
         lVar26 < in_ST2)) {
        __kmp_debug_assert("assertion failure",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-openmp-runtime/src/kmp_dispatch.cpp"
                           ,0x42b);
      }
      (pdVar22->u).p64.field_6.parm2 = (kmp_int64)__return_storage_ptr__;
      base._10_2_ = in_stack_fffffffffffffeb2;
      base._0_10_ = x;
      base._12_4_ = in_stack_fffffffffffffeb4;
      uVar11 = __kmp_dispatch_guided_remaining<long_long>
                         (uVar7,(floating_t_conflict)base,
                          (unsigned_t_conflict)__return_storage_ptr__);
      pvVar13 = (void *)((long)local_d8 * (long)__return_storage_ptr__ + uVar11);
      (pdVar22->u).p64.count = uVar7 - (long)pvVar13;
      sVar21 = kmp_sch_guided_analytical_chunked;
      break;
    }
LAB_00151c97:
    sVar21 = kmp_sch_dynamic_chunked;
    break;
  case 0xb:
    iVar4 = (pkVar3->t).t_nproc;
    uVar18 = (ulong)iVar4;
    uVar9 = ((long)uVar7 / (long)local_d8 + 1) - (ulong)((long)uVar7 % (long)local_d8 == 0);
    if ((1 < (long)uVar18) && ((long)uVar18 <= (long)uVar9)) {
      pvVar13 = (void *)(long)*(int *)(__kmp_threads[gtid]->th_pad + 0x20);
      pvVar14 = (void *)(uVar9 % uVar18);
      pvVar15 = pvVar14;
      if ((long)pvVar13 <= (long)pvVar14) {
        pvVar15 = pvVar13;
      }
      pvVar15 = (void *)((long)pvVar15 + (uVar9 / uVar18) * (long)pvVar13);
      (pdVar22->u).p64.count = (kmp_int64)pvVar15;
      (pdVar22->u).p64.ub = (ulong)((long)pvVar13 < (long)pvVar14) + uVar9 / uVar18 + (long)pvVar15;
      (pdVar22->u).p64.field_6.parm2 = lb;
      (pdVar22->u).p64.field_6.parm4 = (kmp_int64)pvVar13;
      (pdVar22->u).p64.st = st;
      sVar21 = kmp_sch_static_steal;
      break;
    }
LAB_00151bed:
    if (iVar4 < 2) {
      if ((long)uVar7 < 1) {
LAB_00151ca4:
        (pdVar22->u).p64.count = 1;
        (pdVar22->u).p64.field_6.parm1 = 0;
        sVar21 = kmp_sch_static_balanced;
        break;
      }
      (pdVar22->u).p64.field_6.parm1 = 1;
      pvVar13 = (void *)(uVar7 - 1);
      pvVar15 = (void *)0x0;
    }
    else {
      pvVar14 = (void *)(long)*(int *)(__kmp_threads[gtid]->th_pad + 0x20);
      if ((long)uVar7 < (long)uVar18) {
        pvVar13 = pvVar14;
        if ((long)uVar7 <= (long)pvVar14) goto LAB_00151ca4;
        *(ulong *)((long)&pdVar22->u + 0x40) = (ulong)((void *)(uVar7 - 1) == pvVar14);
        pvVar15 = pvVar14;
      }
      else {
        pvVar13 = (void *)(uVar7 % uVar18);
        pvVar15 = pvVar13;
        if ((long)pvVar14 <= (long)pvVar13) {
          pvVar15 = pvVar14;
        }
        pvVar15 = (void *)((long)pvVar15 + (uVar7 / uVar18) * (long)pvVar14);
        pvVar13 = (void *)((long)pvVar15 +
                          (uVar7 / uVar18 - (ulong)((long)pvVar13 <= (long)pvVar14)));
        *(ulong *)((long)&pdVar22->u + 0x40) = (ulong)((void *)(uVar18 - 1) == pvVar14);
      }
    }
    if (bVar24) {
      local_108 = (void *)((long)pvVar13 + (1 - (long)pvVar15));
    }
    if (bVar23) {
      (pdVar22->u).p64.lb = (long)pvVar15 + lb;
      lVar10 = lb + (long)pvVar13;
    }
    else {
      lVar10 = (long)pvVar13 * st + lb;
      (pdVar22->u).p64.lb = (long)pvVar15 * st + lb;
      if (st < 1) {
        if (lVar10 + st < ub) {
          lVar10 = ub;
        }
      }
      else if (ub < lVar10 + st) {
        lVar10 = ub;
      }
    }
    (pdVar22->u).p64.ub = lVar10;
    sVar21 = kmp_sch_static_balanced;
    if (pdVar22->ordered != 0) {
      (pdVar22->u).p64.ordered_lower = (kmp_uint64)pvVar15;
      (pdVar22->u).p64.ordered_upper = (kmp_uint64)pvVar13;
    }
  }
LAB_00151d98:
  pdVar22->schedule = sVar21;
  if (iVar1 == 0) {
    __kmp_wait_yield<unsigned_int>(&local_90->buffer_index,local_110,__kmp_eq<unsigned_int>,pvVar13)
    ;
    ((pkVar2->th).th_dispatch)->th_dispatch_pr_current = pdVar22;
    ((pkVar2->th).th_dispatch)->th_dispatch_sh_current = local_90;
    if (pdVar22->ordered != 0) {
      __kmp_itt_ordered_init(gtid);
    }
    if (bVar24) {
      sched_type = 1;
      switch(sVar21) {
      default:
        sched_type = 3;
        break;
      case kmp_sch_dynamic_chunked:
        break;
      case kmp_sch_static_greedy:
        local_108 = (void *)(pdVar22->u).p64.field_6.parm1;
      case kmp_sch_static_chunked:
      case kmp_sch_static_balanced:
        sched_type = 0;
        break;
      case kmp_sch_guided_iterative_chunked:
      case kmp_sch_guided_analytical_chunked:
        sched_type = 2;
      }
      __kmp_itt_metadata_loop(loc,sched_type,uVar7,(kmp_uint64)local_108);
    }
  }
  return;
}

Assistant:

static void
__kmp_dispatch_init(
    ident_t                        * loc,
    int                              gtid,
    enum sched_type                  schedule,
    T                                lb,
    T                                ub,
    typename traits_t< T >::signed_t st,
    typename traits_t< T >::signed_t chunk,
    int                              push_ws
) {
    typedef typename traits_t< T >::unsigned_t  UT;
    typedef typename traits_t< T >::signed_t    ST;
    typedef typename traits_t< T >::floating_t  DBL;
    static const int ___kmp_size_type = sizeof( UT );

    int                                            active;
    T                                              tc;
    kmp_info_t *                                   th;
    kmp_team_t *                                   team;
    kmp_uint32                                     my_buffer_index;
    dispatch_private_info_template< T >          * pr;
    dispatch_shared_info_template< UT > volatile * sh;

    KMP_BUILD_ASSERT( sizeof( dispatch_private_info_template< T > ) == sizeof( dispatch_private_info ) );
    KMP_BUILD_ASSERT( sizeof( dispatch_shared_info_template< UT > ) == sizeof( dispatch_shared_info ) );

    if ( ! TCR_4( __kmp_init_parallel ) )
        __kmp_parallel_initialize();

#if INCLUDE_SSC_MARKS
    SSC_MARK_DISPATCH_INIT();
#endif
    #ifdef KMP_DEBUG
    {
        const char * buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_init: T#%%d called: schedule:%%d chunk:%%%s lb:%%%s ub:%%%s st:%%%s\n",
            traits_t< ST >::spec, traits_t< T >::spec, traits_t< T >::spec, traits_t< ST >::spec );
        KD_TRACE(10, ( buff, gtid, schedule, chunk, lb, ub, st ) );
        __kmp_str_free( &buff );
    }
    #endif
    /* setup data */
    th     = __kmp_threads[ gtid ];
    team   = th -> th.th_team;
    active = ! team -> t.t_serialized;
    th->th.th_ident = loc;

#if USE_ITT_BUILD
    kmp_uint64 cur_chunk = chunk;
    int itt_need_metadata_reporting = __itt_metadata_add_ptr && __kmp_forkjoin_frames_mode == 3 &&
        KMP_MASTER_GTID(gtid) &&
#if OMP_40_ENABLED
        th->th.th_teams_microtask == NULL &&
#endif
        team->t.t_active_level == 1;
#endif
    if ( ! active ) {
        pr = reinterpret_cast< dispatch_private_info_template< T >* >
            ( th -> th.th_dispatch -> th_disp_buffer ); /* top of the stack */
    } else {
        KMP_DEBUG_ASSERT( th->th.th_dispatch ==
                &th->th.th_team->t.t_dispatch[th->th.th_info.ds.ds_tid] );

        my_buffer_index = th->th.th_dispatch->th_disp_index ++;

        /* What happens when number of threads changes, need to resize buffer? */
        pr = reinterpret_cast< dispatch_private_info_template< T >  * >
            ( &th -> th.th_dispatch -> th_disp_buffer[ my_buffer_index % __kmp_dispatch_num_buffers ] );
        sh = reinterpret_cast< dispatch_shared_info_template< UT > volatile * >
            ( &team -> t.t_disp_buffer[ my_buffer_index % __kmp_dispatch_num_buffers ] );
    }

    /* Currently just ignore the monotonic and non-monotonic modifiers (the compiler isn't producing them
     * yet anyway).
     * When it is we'll want to look at them somewhere here and use that information to add to our
     * schedule choice. We shouldn't need to pass them on, they merely affect which schedule we can
     * legally choose for various dynamic cases. (In paritcular, whether or not a stealing scheme is legal).
     */
    schedule = SCHEDULE_WITHOUT_MODIFIERS(schedule);

    /* Pick up the nomerge/ordered bits from the scheduling type */
    if ( (schedule >= kmp_nm_lower) && (schedule < kmp_nm_upper) ) {
        pr->nomerge = TRUE;
        schedule = (enum sched_type)(((int)schedule) - (kmp_nm_lower - kmp_sch_lower));
    } else {
        pr->nomerge = FALSE;
    }
    pr->type_size = ___kmp_size_type; // remember the size of variables
    if ( kmp_ord_lower & schedule ) {
        pr->ordered = TRUE;
        schedule = (enum sched_type)(((int)schedule) - (kmp_ord_lower - kmp_sch_lower));
    } else {
        pr->ordered = FALSE;
    }

    if ( schedule == kmp_sch_static ) {
        schedule = __kmp_static;
    } else {
        if ( schedule == kmp_sch_runtime ) {
            // Use the scheduling specified by OMP_SCHEDULE (or __kmp_sch_default if not specified)
            schedule = team -> t.t_sched.r_sched_type;
            // Detail the schedule if needed (global controls are differentiated appropriately)
            if ( schedule == kmp_sch_guided_chunked ) {
                schedule = __kmp_guided;
            } else if ( schedule == kmp_sch_static ) {
                schedule = __kmp_static;
            }
            // Use the chunk size specified by OMP_SCHEDULE (or default if not specified)
            chunk = team -> t.t_sched.chunk;
#if USE_ITT_BUILD
            cur_chunk = chunk;
#endif
            #ifdef KMP_DEBUG
            {
                const char * buff;
                // create format specifiers before the debug output
                buff = __kmp_str_format(
                    "__kmp_dispatch_init: T#%%d new: schedule:%%d chunk:%%%s\n",
                    traits_t< ST >::spec );
                KD_TRACE(10, ( buff, gtid, schedule, chunk ) );
                __kmp_str_free( &buff );
            }
            #endif
        } else {
            if ( schedule == kmp_sch_guided_chunked ) {
                schedule = __kmp_guided;
            }
            if ( chunk <= 0 ) {
                chunk = KMP_DEFAULT_CHUNK;
            }
        }

        if ( schedule == kmp_sch_auto ) {
            // mapping and differentiation: in the __kmp_do_serial_initialize()
            schedule = __kmp_auto;
            #ifdef KMP_DEBUG
            {
                const char * buff;
                // create format specifiers before the debug output
                buff = __kmp_str_format(
                    "__kmp_dispatch_init: kmp_sch_auto: T#%%d new: schedule:%%d chunk:%%%s\n",
                    traits_t< ST >::spec );
                KD_TRACE(10, ( buff, gtid, schedule, chunk ) );
                __kmp_str_free( &buff );
            }
            #endif
        }

        /* guided analytical not safe for too many threads */
        if ( team->t.t_nproc > 1<<20 && schedule == kmp_sch_guided_analytical_chunked ) {
            schedule = kmp_sch_guided_iterative_chunked;
            KMP_WARNING( DispatchManyThreads );
        }
        pr->u.p.parm1 = chunk;
    }
    KMP_ASSERT2( (kmp_sch_lower < schedule && schedule < kmp_sch_upper),
                "unknown scheduling type" );

    pr->u.p.count = 0;

    if ( __kmp_env_consistency_check ) {
        if ( st == 0 ) {
            __kmp_error_construct(
                kmp_i18n_msg_CnsLoopIncrZeroProhibited,
                ( pr->ordered ? ct_pdo_ordered : ct_pdo ), loc
            );
        }
    }
    // compute trip count
    if ( st == 1 ) {   // most common case
        if ( ub >= lb ) {
            tc = ub - lb + 1;
        } else {   // ub < lb
            tc = 0;            // zero-trip
        }
    } else if ( st < 0 ) {
        if ( lb >= ub ) {
            // AC: cast to unsigned is needed for loops like (i=2B; i>-2B; i-=1B),
            //     where the division needs to be unsigned regardless of the result type
            tc = (UT)(lb - ub) / (-st) + 1;
        } else {   // lb < ub
            tc = 0;            // zero-trip
        }
    } else {       // st > 0
        if ( ub >= lb ) {
            // AC: cast to unsigned is needed for loops like (i=-2B; i<2B; i+=1B),
            //     where the division needs to be unsigned regardless of the result type
            tc = (UT)(ub - lb) / st + 1;
        } else {   // ub < lb
            tc = 0;            // zero-trip
        }
    }

    // Any half-decent optimizer will remove this test when the blocks are empty since the macros expand to nothing
    // when statistics are disabled.
    if (schedule == __kmp_static)
    {
        KMP_COUNT_BLOCK(OMP_FOR_static);
        KMP_COUNT_VALUE(FOR_static_iterations, tc);
    }
    else
    {
        KMP_COUNT_BLOCK(OMP_FOR_dynamic);
        KMP_COUNT_VALUE(FOR_dynamic_iterations, tc);
    }

    pr->u.p.lb = lb;
    pr->u.p.ub = ub;
    pr->u.p.st = st;
    pr->u.p.tc = tc;

    #if KMP_OS_WINDOWS
    pr->u.p.last_upper = ub + st;
    #endif /* KMP_OS_WINDOWS */

    /* NOTE: only the active parallel region(s) has active ordered sections */

    if ( active ) {
        if ( pr->ordered == 0 ) {
            th -> th.th_dispatch -> th_deo_fcn = __kmp_dispatch_deo_error;
            th -> th.th_dispatch -> th_dxo_fcn = __kmp_dispatch_dxo_error;
        } else {
            pr->ordered_bumped = 0;

            pr->u.p.ordered_lower = 1;
            pr->u.p.ordered_upper = 0;

            th -> th.th_dispatch -> th_deo_fcn = __kmp_dispatch_deo< UT >;
            th -> th.th_dispatch -> th_dxo_fcn = __kmp_dispatch_dxo< UT >;
        }
    }

    if ( __kmp_env_consistency_check ) {
        enum cons_type ws = pr->ordered ? ct_pdo_ordered : ct_pdo;
        if ( push_ws ) {
            __kmp_push_workshare( gtid, ws, loc );
            pr->pushed_ws = ws;
        } else {
            __kmp_check_workshare( gtid, ws, loc );
            pr->pushed_ws = ct_none;
        }
    }

    switch ( schedule ) {
    #if  ( KMP_STATIC_STEAL_ENABLED && KMP_ARCH_X86_64 )
    case kmp_sch_static_steal:
        {
            T nproc = team->t.t_nproc;
            T ntc, init;

            KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_static_steal case\n", gtid ) );

            ntc = (tc % chunk ? 1 : 0) + tc / chunk;
            if ( nproc > 1 && ntc >= nproc ) {
                T id = __kmp_tid_from_gtid(gtid);
                T small_chunk, extras;

                small_chunk = ntc / nproc;
                extras = ntc % nproc;

                init = id * small_chunk + ( id < extras ? id : extras );
                pr->u.p.count = init;
                pr->u.p.ub = init + small_chunk + ( id < extras ? 1 : 0 );

                pr->u.p.parm2 = lb;
                //pr->pfields.parm3 = 0; // it's not used in static_steal
                pr->u.p.parm4 = id;
                pr->u.p.st = st;
                break;
            } else {
                KD_TRACE(100, ("__kmp_dispatch_init: T#%d falling-through to kmp_sch_static_balanced\n",
                               gtid ) );
                schedule = kmp_sch_static_balanced;
                /* too few iterations: fall-through to kmp_sch_static_balanced */
            } // if
            /* FALL-THROUGH to static balanced */
        } // case
    #endif
    case kmp_sch_static_balanced:
        {
            T nproc = team->t.t_nproc;
            T init, limit;

            KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_static_balanced case\n",
                            gtid ) );

            if ( nproc > 1 ) {
                T id = __kmp_tid_from_gtid(gtid);

                if ( tc < nproc ) {
                    if ( id < tc ) {
                        init = id;
                        limit = id;
                        pr->u.p.parm1 = (id == tc - 1);  /* parm1 stores *plastiter */
                    } else {
                        pr->u.p.count = 1;  /* means no more chunks to execute */
                        pr->u.p.parm1 = FALSE;
                        break;
                    }
                } else {
                    T small_chunk = tc / nproc;
                    T extras = tc % nproc;
                    init = id * small_chunk + (id < extras ? id : extras);
                    limit = init + small_chunk - (id < extras ? 0 : 1);
                    pr->u.p.parm1 = (id == nproc - 1);
                }
            } else {
                if ( tc > 0 ) {
                    init = 0;
                    limit = tc - 1;
                    pr->u.p.parm1 = TRUE;
                } else {
                    // zero trip count
                    pr->u.p.count = 1;  /* means no more chunks to execute */
                    pr->u.p.parm1 = FALSE;
                    break;
                }
            }
#if USE_ITT_BUILD
            // Calculate chunk for metadata report
            if ( itt_need_metadata_reporting )
                cur_chunk = limit - init + 1;
#endif
            if ( st == 1 ) {
                pr->u.p.lb = lb + init;
                pr->u.p.ub = lb + limit;
            } else {
                T ub_tmp = lb + limit * st;   // calculated upper bound, "ub" is user-defined upper bound
                pr->u.p.lb = lb + init * st;
                // adjust upper bound to "ub" if needed, so that MS lastprivate will match it exactly
                if ( st > 0 ) {
                    pr->u.p.ub = ( ub_tmp + st > ub ? ub : ub_tmp );
                } else {
                    pr->u.p.ub = ( ub_tmp + st < ub ? ub : ub_tmp );
                }
            }
            if ( pr->ordered ) {
                pr->u.p.ordered_lower = init;
                pr->u.p.ordered_upper = limit;
            }
            break;
        } // case
    case kmp_sch_guided_iterative_chunked :
        {
            T nproc = team->t.t_nproc;
            KD_TRACE(100,("__kmp_dispatch_init: T#%d kmp_sch_guided_iterative_chunked case\n",gtid));

            if ( nproc > 1 ) {
                if ( (2L * chunk + 1 ) * nproc >= tc ) {
                    /* chunk size too large, switch to dynamic */
                    schedule = kmp_sch_dynamic_chunked;
                } else {
                    // when remaining iters become less than parm2 - switch to dynamic
                    pr->u.p.parm2 = guided_int_param * nproc * ( chunk + 1 );
                    *(double*)&pr->u.p.parm3 = guided_flt_param / nproc;   // may occupy parm3 and parm4
                }
            } else {
                KD_TRACE(100,("__kmp_dispatch_init: T#%d falling-through to kmp_sch_static_greedy\n",gtid));
                schedule = kmp_sch_static_greedy;
                /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
                KD_TRACE(100,("__kmp_dispatch_init: T#%d kmp_sch_static_greedy case\n",gtid));
                pr->u.p.parm1 = tc;
            } // if
        } // case
        break;
    case kmp_sch_guided_analytical_chunked:
        {
            T nproc = team->t.t_nproc;
            KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_guided_analytical_chunked case\n", gtid));

            if ( nproc > 1 ) {
                if ( (2L * chunk + 1 ) * nproc >= tc ) {
                    /* chunk size too large, switch to dynamic */
                    schedule = kmp_sch_dynamic_chunked;
                } else {
                    /* commonly used term: (2 nproc - 1)/(2 nproc) */
                    DBL x;

                    #if KMP_OS_WINDOWS && KMP_ARCH_X86
                    /* Linux* OS already has 64-bit computation by default for
		       long double, and on Windows* OS on Intel(R) 64,
		       /Qlong_double doesn't work.  On Windows* OS
		       on IA-32 architecture, we need to set precision to
		       64-bit instead of the default 53-bit. Even though long
		       double doesn't work on Windows* OS on Intel(R) 64, the
		       resulting lack of precision is not expected to impact
		       the correctness of the algorithm, but this has not been
		       mathematically proven.
                    */
                    // save original FPCW and set precision to 64-bit, as
                    // Windows* OS on IA-32 architecture defaults to 53-bit
                    unsigned int oldFpcw = _control87(0,0);
                    _control87(_PC_64,_MCW_PC); // 0,0x30000
                    #endif
                    /* value used for comparison in solver for cross-over point */
                    long double target = ((long double)chunk * 2 + 1) * nproc / tc;

                    /* crossover point--chunk indexes equal to or greater than
		       this point switch to dynamic-style scheduling */
                    UT   cross;

                    /* commonly used term: (2 nproc - 1)/(2 nproc) */
                    x = (long double)1.0 - (long double)0.5 / nproc;

                    #ifdef KMP_DEBUG
                    { // test natural alignment
                        struct _test_a {
                            char a;
                            union {
                                char b;
                                DBL  d;
                            };
                        } t;
                        ptrdiff_t natural_alignment = (ptrdiff_t)&t.b - (ptrdiff_t)&t - (ptrdiff_t)1;
                        //__kmp_warn( " %llx %llx %lld", (long long)&t.d, (long long)&t, (long long)natural_alignment );
                        KMP_DEBUG_ASSERT( ( ( (ptrdiff_t)&pr->u.p.parm3 ) & ( natural_alignment ) ) == 0 );
                    }
                    #endif // KMP_DEBUG

                    /* save the term in thread private dispatch structure */
                    *(DBL*)&pr->u.p.parm3 = x;

                    /* solve for the crossover point to the nearest integer i for which C_i <= chunk */
                    {
                        UT          left, right, mid;
                        long double p;

                        /* estimate initial upper and lower bound */

                        /* doesn't matter what value right is as long as it is positive, but
                           it affects performance of the solver
                        */
                        right = 229;
                        p = __kmp_pow< UT >(x,right);
                        if ( p > target ) {
                            do{
                                p *= p;
                                right <<= 1;
                            } while(p>target && right < (1<<27));
                            left = right >> 1; /* lower bound is previous (failed) estimate of upper bound */
                        } else {
                            left = 0;
                        }

                        /* bisection root-finding method */
                        while ( left + 1 < right ) {
                            mid = (left + right) / 2;
                            if ( __kmp_pow< UT >(x,mid) > target ) {
                                left = mid;
                            } else {
                                right = mid;
                            }
                        } // while
                        cross = right;
                    }
                    /* assert sanity of computed crossover point */
                    KMP_ASSERT(cross && __kmp_pow< UT >(x, cross - 1) > target && __kmp_pow< UT >(x, cross) <= target);

                    /* save the crossover point in thread private dispatch structure */
                    pr->u.p.parm2 = cross;

                    // C75803
                    #if ( ( KMP_OS_LINUX || KMP_OS_WINDOWS ) && KMP_ARCH_X86 ) && ( ! defined( KMP_I8 ) )
                        #define GUIDED_ANALYTICAL_WORKAROUND (*( DBL * )&pr->u.p.parm3)
                    #else
                        #define GUIDED_ANALYTICAL_WORKAROUND (x)
                    #endif
                    /* dynamic-style scheduling offset */
                    pr->u.p.count = tc - __kmp_dispatch_guided_remaining(tc, GUIDED_ANALYTICAL_WORKAROUND, cross) - cross * chunk;
                    #if KMP_OS_WINDOWS && KMP_ARCH_X86
                        // restore FPCW
                        _control87(oldFpcw,_MCW_PC);
                    #endif
                } // if
            } else {
                KD_TRACE(100, ("__kmp_dispatch_init: T#%d falling-through to kmp_sch_static_greedy\n",
                               gtid ) );
                schedule = kmp_sch_static_greedy;
                /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
                pr->u.p.parm1 = tc;
            } // if
        } // case
        break;
    case kmp_sch_static_greedy:
        KD_TRACE(100,("__kmp_dispatch_init: T#%d kmp_sch_static_greedy case\n",gtid));
            pr->u.p.parm1 = ( team -> t.t_nproc > 1 ) ?
                ( tc + team->t.t_nproc - 1 ) / team->t.t_nproc :
                tc;
        break;
    case kmp_sch_static_chunked :
    case kmp_sch_dynamic_chunked :
        if ( pr->u.p.parm1 <= 0 ) {
            pr->u.p.parm1 = KMP_DEFAULT_CHUNK;
        }
        KD_TRACE(100,("__kmp_dispatch_init: T#%d kmp_sch_static_chunked/kmp_sch_dynamic_chunked cases\n", gtid));
        break;
    case kmp_sch_trapezoidal :
        {
            /* TSS: trapezoid self-scheduling, minimum chunk_size = parm1 */

            T parm1, parm2, parm3, parm4;
            KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_trapezoidal case\n", gtid ) );

            parm1 = chunk;

            /* F : size of the first cycle */
            parm2 = ( tc / (2 * team->t.t_nproc) );

            if ( parm2 < 1 ) {
                parm2 = 1;
            }

            /* L : size of the last cycle.  Make sure the last cycle
             *     is not larger than the first cycle.
             */
            if ( parm1 < 1 ) {
                parm1 = 1;
            } else if ( parm1 > parm2 ) {
                parm1 = parm2;
            }

            /* N : number of cycles */
            parm3 = ( parm2 + parm1 );
            parm3 = ( 2 * tc + parm3 - 1) / parm3;

            if ( parm3 < 2 ) {
                parm3 = 2;
            }

            /* sigma : decreasing incr of the trapezoid */
            parm4 = ( parm3 - 1 );
            parm4 = ( parm2 - parm1 ) / parm4;

            // pointless check, because parm4 >= 0 always
            //if ( parm4 < 0 ) {
            //    parm4 = 0;
            //}

            pr->u.p.parm1 = parm1;
            pr->u.p.parm2 = parm2;
            pr->u.p.parm3 = parm3;
            pr->u.p.parm4 = parm4;
        } // case
        break;

    default:
        {
            __kmp_msg(
                kmp_ms_fatal,                        // Severity
                KMP_MSG( UnknownSchedTypeDetected ), // Primary message
                KMP_HNT( GetNewerLibrary ),          // Hint
                __kmp_msg_null                       // Variadic argument list terminator
            );
        }
        break;
    } // switch
    pr->schedule = schedule;
    if ( active ) {
        /* The name of this buffer should be my_buffer_index when it's free to use it */

        KD_TRACE(100, ("__kmp_dispatch_init: T#%d before wait: my_buffer_index:%d sh->buffer_index:%d\n",
                        gtid, my_buffer_index, sh->buffer_index) );
        __kmp_wait_yield< kmp_uint32 >( & sh->buffer_index, my_buffer_index, __kmp_eq< kmp_uint32 >
                                        USE_ITT_BUILD_ARG( NULL )
                                        );
            // Note: KMP_WAIT_YIELD() cannot be used there: buffer index and my_buffer_index are
            // *always* 32-bit integers.
        KMP_MB();  /* is this necessary? */
        KD_TRACE(100, ("__kmp_dispatch_init: T#%d after wait: my_buffer_index:%d sh->buffer_index:%d\n",
                        gtid, my_buffer_index, sh->buffer_index) );

        th -> th.th_dispatch -> th_dispatch_pr_current = (dispatch_private_info_t*) pr;
        th -> th.th_dispatch -> th_dispatch_sh_current = (dispatch_shared_info_t*)  sh;
#if USE_ITT_BUILD
        if ( pr->ordered ) {
            __kmp_itt_ordered_init( gtid );
        }; // if
        // Report loop metadata
        if ( itt_need_metadata_reporting ) {
            // Only report metadata by master of active team at level 1
            kmp_uint64 schedtype = 0;
            switch ( schedule ) {
            case kmp_sch_static_chunked:
            case kmp_sch_static_balanced:// Chunk is calculated in the switch above
                break;
            case kmp_sch_static_greedy:
                cur_chunk = pr->u.p.parm1;
                break;
            case kmp_sch_dynamic_chunked:
                schedtype = 1;
                break;
            case kmp_sch_guided_iterative_chunked:
            case kmp_sch_guided_analytical_chunked:
                schedtype = 2;
                break;
            default:
//            Should we put this case under "static"?
//            case kmp_sch_static_steal:
                schedtype = 3;
                break;
            }
            __kmp_itt_metadata_loop(loc, schedtype, tc, cur_chunk);
        }
#endif /* USE_ITT_BUILD */
    }; // if

    #ifdef KMP_DEBUG
    {
        const char * buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_init: T#%%d returning: schedule:%%d ordered:%%%s lb:%%%s ub:%%%s" \
            " st:%%%s tc:%%%s count:%%%s\n\tordered_lower:%%%s ordered_upper:%%%s" \
            " parm1:%%%s parm2:%%%s parm3:%%%s parm4:%%%s\n",
            traits_t< UT >::spec, traits_t< T >::spec, traits_t< T >::spec,
            traits_t< ST >::spec, traits_t< UT >::spec, traits_t< UT >::spec,
            traits_t< UT >::spec, traits_t< UT >::spec, traits_t< T >::spec,
            traits_t< T >::spec, traits_t< T >::spec, traits_t< T >::spec );
        KD_TRACE(10, ( buff,
            gtid, pr->schedule, pr->ordered, pr->u.p.lb, pr->u.p.ub,
            pr->u.p.st, pr->u.p.tc, pr->u.p.count,
            pr->u.p.ordered_lower, pr->u.p.ordered_upper, pr->u.p.parm1,
            pr->u.p.parm2, pr->u.p.parm3, pr->u.p.parm4 ) );
        __kmp_str_free( &buff );
    }
    #endif
    #if ( KMP_STATIC_STEAL_ENABLED )
    if ( ___kmp_size_type < 8 ) {
      // It cannot be guaranteed that after execution of a loop with some other schedule kind
      // all the parm3 variables will contain the same value.
      // Even if all parm3 will be the same, it still exists a bad case like using 0 and 1
      // rather than program life-time increment.
      // So the dedicated variable is required. The 'static_steal_counter' is used.
      if( schedule == kmp_sch_static_steal ) {
        // Other threads will inspect this variable when searching for a victim.
        // This is a flag showing that other threads may steal from this thread since then.
        volatile T * p = &pr->u.p.static_steal_counter;
        *p = *p + 1;
      }
    }
    #endif // ( KMP_STATIC_STEAL_ENABLED && USE_STEALING )

#if OMPT_SUPPORT && OMPT_TRACE
    if (ompt_enabled &&
        ompt_callbacks.ompt_callback(ompt_event_loop_begin)) {
        ompt_team_info_t *team_info = __ompt_get_teaminfo(0, NULL);
        ompt_task_info_t *task_info = __ompt_get_taskinfo(0);
        ompt_callbacks.ompt_callback(ompt_event_loop_begin)(
            team_info->parallel_id, task_info->task_id, team_info->microtask);
    }
#endif
}